

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

enable_if_t<IteratorRange<const_double_(*)[3],_double[3]>::is_container> __thiscall
gnuplotio::
deref_and_print<gnuplotio::IteratorRange<double_const(*)[3],double[3]>,gnuplotio::ModeText>
          (gnuplotio *this,IteratorRange<const_double_(*)[3],_double[3]> *stream,undefined8 param_3,
          int param_4)

{
  plotting_empty_container *this_00;
  size_t __n;
  size_t __n_00;
  subiter_type local_38;
  value_type local_28;
  
  if (stream->it != stream->end) {
    local_38 = IteratorRange<const_double_(*)[3],_double[3]>::deref_subiter(stream);
    if (local_38.it != local_38.end) {
      local_28 = IteratorRange<const_double_*,_double>::deref(&local_38);
      FloatTextSender<double>::send((int)this,&local_28,__n,param_4);
      if (local_38.it + 1 != local_38.end) {
        local_38.it = local_38.it + 1;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
          local_28 = IteratorRange<const_double_*,_double>::deref(&local_38);
          FloatTextSender<double>::send((int)this,&local_28,__n_00,param_4);
          local_38.it = local_38.it + 1;
        } while (local_38.it != local_38.end);
      }
    }
    return;
  }
  this_00 = (plotting_empty_container *)__cxa_allocate_exception(0x10);
  plotting_empty_container::plotting_empty_container(this_00);
  __cxa_throw(this_00,&plotting_empty_container::typeinfo,std::length_error::~length_error);
}

Assistant:

bool is_end() const { return it == end; }